

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-gost3411.c
# Opt level: O0

void p_crypto_hash_gost3411_update(PHashGOST3411 *ctx,puchar *data,psize len)

{
  puint32 local_48;
  undefined4 local_44;
  puint32 len256 [8];
  puint32 to_fill;
  puint32 left;
  psize len_local;
  puchar *data_local;
  PHashGOST3411 *ctx_local;
  
  len256[7] = (ctx->len[0] & 0xff) >> 3;
  len256[6] = 0x20 - len256[7];
  memset(&local_48,0,0x20);
  local_48 = (puint32)(len << 3);
  local_44 = (undefined4)(len >> 0x1d);
  pp_crypto_hash_gost3411_sum_256(ctx->len,&local_48);
  _to_fill = len;
  len_local = (psize)data;
  if ((len256[7] != 0) && (len256[6] <= (uint)len)) {
    memcpy((void *)((long)ctx->buf + (ulong)len256[7]),data,(ulong)len256[6]);
    pp_crypto_hash_gost3411_swap_bytes(ctx->buf,8);
    pp_crypto_hash_gost3411_process(ctx,ctx->buf);
    pp_crypto_hash_gost3411_sum_256(ctx->sum,ctx->buf);
    len_local = (psize)(data + len256[6]);
    _to_fill = len - len256[6];
    len256[7] = 0;
  }
  for (; 0x1f < _to_fill; _to_fill = _to_fill - 0x20) {
    *(undefined8 *)ctx->buf = *(undefined8 *)len_local;
    *(undefined8 *)(ctx->buf + 2) = *(undefined8 *)(len_local + 8);
    *(undefined8 *)(ctx->buf + 4) = *(undefined8 *)(len_local + 0x10);
    *(undefined8 *)(ctx->buf + 6) = *(undefined8 *)(len_local + 0x18);
    pp_crypto_hash_gost3411_swap_bytes(ctx->buf,8);
    pp_crypto_hash_gost3411_process(ctx,ctx->buf);
    pp_crypto_hash_gost3411_sum_256(ctx->sum,ctx->buf);
    len_local = len_local + 0x20;
  }
  if (_to_fill != 0) {
    memcpy((void *)((long)ctx->buf + (ulong)len256[7]),(void *)len_local,_to_fill);
  }
  return;
}

Assistant:

void
p_crypto_hash_gost3411_update (PHashGOST3411	*ctx,
			       const puchar	*data,
			       psize		len)
{
	puint32	left;
	puint32	to_fill;
	puint32	len256[8];

	left = (ctx->len[0] & 0xFF) >> 3;
	to_fill = 32 - left;

	memset (len256, 0, 32);
	len256[0] = (puint32) (len << 3);
	len256[1] = (puint32) (len >> 29);

	pp_crypto_hash_gost3411_sum_256 (ctx->len, len256);

	if (left && (puint32) len >= to_fill) {
		memcpy ((pchar *) ctx->buf + left, data, to_fill);
		pp_crypto_hash_gost3411_swap_bytes (ctx->buf, 8);
		pp_crypto_hash_gost3411_process (ctx, ctx->buf);
		pp_crypto_hash_gost3411_sum_256 (ctx->sum, ctx->buf);

		data += to_fill;
		len -= to_fill;
		left = 0;
	}

	while (len >= 32) {
		memcpy (ctx->buf, data, 32);
		pp_crypto_hash_gost3411_swap_bytes (ctx->buf, 8);
		pp_crypto_hash_gost3411_process (ctx, ctx->buf);
		pp_crypto_hash_gost3411_sum_256 (ctx->sum, ctx->buf);

		data += 32;
		len -= 32;
	}

	if (len > 0)
		memcpy ((pchar *) ctx->buf + left, data, len);
}